

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc>::
emplace<QOpenGLProgramBinaryCache::ShaderDesc>
          (QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc> *this,qsizetype i,
          ShaderDesc *args)

{
  qsizetype *pqVar1;
  ShaderDesc **ppSVar2;
  Data *pDVar3;
  long lVar4;
  ShaderDesc *pSVar5;
  Data *pDVar6;
  char *pcVar7;
  qsizetype qVar8;
  long in_FS_OFFSET;
  bool bVar9;
  Inserter local_98;
  ShaderDesc local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00588f67:
    local_48._4_4_ = 0xaaaaaaaa;
    local_48.stage = args->stage;
    local_48.source.d.d = (args->source).d.d;
    local_48.source.d.ptr = (args->source).d.ptr;
    (args->source).d.d = (Data *)0x0;
    (args->source).d.ptr = (char *)0x0;
    local_48.source.d.size = (args->source).d.size;
    (args->source).d.size = 0;
    bVar9 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size != 0;
    QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>::detachAndGrow
              (&this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>,
               (uint)(i == 0 && bVar9),1,(ShaderDesc **)0x0,
               (QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc> *)0x0);
    qVar8 = local_48.source.d.size;
    pcVar7 = local_48.source.d.ptr;
    pDVar6 = local_48.source.d.d;
    if (i == 0 && bVar9) {
      pSVar5 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
      pSVar5[-1].stage = local_48.stage;
      local_48.source.d.d = (Data *)0x0;
      pSVar5[-1].source.d.d = pDVar6;
      local_48.source.d.ptr = (char *)0x0;
      pSVar5[-1].source.d.ptr = pcVar7;
      local_48.source.d.size = 0;
      pSVar5[-1].source.d.size = qVar8;
      (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr = pSVar5 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_98.sourceCopyConstruct = 0;
      local_98.nSource = 0;
      local_98.move = 0;
      local_98.sourceCopyAssign = 0;
      local_98.end = (ShaderDesc *)0x0;
      local_98.last = (ShaderDesc *)0x0;
      local_98.where = (ShaderDesc *)0x0;
      local_98.begin = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
      local_98.size = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size;
      local_98.data = &this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>;
      Inserter::insertOne(&local_98,i,&local_48);
      (local_98.data)->ptr = local_98.begin;
      (local_98.data)->size = local_98.size;
    }
    if (&(local_48.source.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.source.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.source.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_48.source.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_48.source.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
        lVar4)) {
      pSVar5 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
      pSVar5[lVar4].stage = args->stage;
      pDVar6 = (args->source).d.d;
      (args->source).d.d = (Data *)0x0;
      pSVar5[lVar4].source.d.d = pDVar6;
      pcVar7 = (args->source).d.ptr;
      (args->source).d.ptr = (char *)0x0;
      pSVar5[lVar4].source.d.ptr = pcVar7;
      qVar8 = (args->source).d.size;
      (args->source).d.size = 0;
      pSVar5[lVar4].source.d.size = qVar8;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((ShaderDesc *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr))
      goto LAB_00588f67;
      pSVar5 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
      pSVar5[-1].stage = args->stage;
      pDVar6 = (args->source).d.d;
      (args->source).d.d = (Data *)0x0;
      pSVar5[-1].source.d.d = pDVar6;
      pcVar7 = (args->source).d.ptr;
      (args->source).d.ptr = (char *)0x0;
      pSVar5[-1].source.d.ptr = pcVar7;
      qVar8 = (args->source).d.size;
      (args->source).d.size = 0;
      pSVar5[-1].source.d.size = qVar8;
      ppSVar2 = &(this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
      *ppSVar2 = *ppSVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }